

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 this;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar2;
  ostream *poVar3;
  int iVar4;
  shared_ptr<SchemeObject> sVar5;
  ParseResult x_1;
  ParseResult x;
  char local_2c1 [9];
  undefined1 local_2b8 [24];
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  long *local_280;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  undefined1 local_270 [24];
  _Head_base<0UL,_TailContext_*,_false> local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  parse_result_t local_238 [2];
  ASTNode *local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_228;
  char *local_220;
  long local_218;
  char local_210;
  undefined7 uStack_20f;
  
  init_scheme();
  if (argc < 2) {
    local_238[0] = END;
    local_230 = (ASTNode *)0x0;
    p_Stack_228 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_220 = &local_210;
    local_218 = 0;
    local_210 = '\0';
    while( true ) {
      while( true ) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">> ",3);
        read_object((ParseResult *)local_2b8,(istream *)&std::cin);
        this_00 = p_Stack_228;
        p_Stack_228 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._16_8_;
        local_230 = (ASTNode *)local_2b8._8_8_;
        local_238[0] = local_2b8._0_4_;
        local_2b8._8_8_ = (ASTNode *)0x0;
        local_2b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        std::__cxx11::string::operator=((string *)&local_220,(string *)&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,
                          CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0])
                          + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._16_8_);
        }
        if (local_238[0] != ERROR) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Parse error: ",0xd);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_220,local_218);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      if (local_238[0] == END) break;
      ASTNode::evaluate((ExecutionResult *)local_270,local_230,&global_context);
      sVar5 = ExecutionResult::force_value((ExecutionResult *)&local_280);
      (**(code **)(*local_280 + 0x10))
                ((ParseResult *)local_2b8,local_280,
                 sVar5.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),
                          local_2b8._8_8_);
      local_2c1[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2c1,1);
      if ((undefined1 *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) != local_2b8 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),
                        (ulong)((long)(_func_int ***)local_2b8._16_8_ + 1));
      }
      if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::default_delete<TailContext>::operator()
                  ((default_delete<TailContext> *)&local_258,local_258._M_head_impl);
      }
      local_258._M_head_impl = (TailContext *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._16_8_);
      }
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,CONCAT71(uStack_20f,local_210) + 1);
    }
    if (p_Stack_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_228);
    }
    iVar4 = 0;
  }
  else {
    std::ifstream::ifstream(local_238,argv[1],_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      iVar4 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: no such file\n",0x14);
    }
    else {
      local_2b8._0_4_ = END;
      local_2b8._8_8_ = (ASTNode *)0x0;
      local_2b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2a0._M_p = (pointer)&local_290;
      local_298 = 0;
      local_290._M_local_buf[0] = '\0';
      while( true ) {
        read_object((ParseResult *)local_270,(istream *)local_238);
        uVar1 = local_270._16_8_;
        local_2b8._8_8_ = local_270._8_8_;
        this = local_2b8._16_8_;
        local_2b8._0_4_ = local_270._0_4_;
        local_270._8_8_ = (ASTNode *)0x0;
        local_270._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2b8._16_8_ = uVar1;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
        std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_head_impl != &local_248) {
          operator_delete(local_258._M_head_impl,local_248._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._16_8_);
        }
        if (local_2b8._0_4_ == ERROR) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Parse error: ",0xd);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_2a0._M_p,local_298);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          iVar4 = 1;
          std::ostream::flush();
          goto LAB_00114d55;
        }
        if (local_2b8._0_4_ == END) break;
        ASTNode::evaluate((ExecutionResult *)local_270,(ASTNode *)local_2b8._8_8_,&global_context);
        ExecutionResult::force_value((ExecutionResult *)&local_280);
        if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
        }
        if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)
            local_258._M_head_impl != (TailContext *)0x0) {
          std::default_delete<TailContext>::operator()
                    ((default_delete<TailContext> *)&local_258,local_258._M_head_impl);
        }
        local_258._M_head_impl = (TailContext *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._16_8_);
        }
      }
      iVar4 = 0;
LAB_00114d55:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,
                        CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) +
                        1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._16_8_);
      }
    }
    std::ifstream::~ifstream(local_238);
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    init_scheme();
    if(argc <= 1)
    {
        return run_REPL();
    }
    else
    {
        std::ifstream infile(argv[1]);
        if(!infile.is_open())
        {
            std::cerr << "Error: no such file\n";
            return 1;
        }
        return run_file(infile);
    }
}